

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O2

void __thiscall
GlobOpt::KillObjectType
          (GlobOpt *this,StackSym *objectSym,BVSparse<Memory::JitArenaAllocator> *liveFields)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  StackSym *pSVar4;
  
  if ((objectSym->field_0x1a & 1) != 0) {
    objectSym = StackSym::GetVarEquivSym(objectSym,this->func);
    if (objectSym == (StackSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x780,"(objectSym)","objectSym");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      objectSym = (StackSym *)0x0;
    }
  }
  bVar2 = StackSym::HasObjectTypeSym(objectSym);
  if (bVar2) {
    if (liveFields == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      liveFields = (this->currentBlock->globOptData).liveFields;
    }
    pSVar4 = StackSym::GetObjectTypeSym(objectSym);
    BVSparse<Memory::JitArenaAllocator>::Clear(liveFields,(pSVar4->super_Sym).m_id);
    pSVar4 = StackSym::GetAuxSlotPtrSym(objectSym);
    if (pSVar4 != (StackSym *)0x0) {
      BVSparse<Memory::JitArenaAllocator>::Clear(liveFields,(pSVar4->super_Sym).m_id);
      return;
    }
  }
  return;
}

Assistant:

void
GlobOpt::KillObjectType(StackSym* objectSym, BVSparse<JitArenaAllocator>* liveFields)
{
    if (objectSym->IsTypeSpec())
    {
        objectSym = objectSym->GetVarEquivSym(this->func);
    }

    Assert(objectSym);

    // We may be conservatively attempting to kill type syms from object syms that don't actually
    // participate in object type specialization and hence don't actually have type syms (yet).
    if (!objectSym->HasObjectTypeSym())
    {
        return;
    }

    if (liveFields == nullptr)
    {
        liveFields = this->currentBlock->globOptData.liveFields;
    }

    liveFields->Clear(objectSym->GetObjectTypeSym()->m_id);
    StackSym *auxSlotPtrSym = objectSym->GetAuxSlotPtrSym();
    if (auxSlotPtrSym)
    {
        liveFields->Clear(auxSlotPtrSym->m_id);
    }
}